

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::LinesGen
          (DrawIndirectBase *this,uint param_1,uint drawSizeY,CColorArray *output)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar1;
  int iVar2;
  Vector<float,_4> local_4c;
  Vector<float,_4> local_3c;
  float local_2c;
  uint local_28;
  float offsetY;
  uint i;
  float rasterSize;
  CColorArray *output_local;
  uint drawSizeY_local;
  uint param_1_local;
  DrawIndirectBase *this_local;
  
  _i = output;
  output_local._0_4_ = drawSizeY;
  output_local._4_4_ = param_1;
  _drawSizeY_local = this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::reserve
            (output,(ulong)(drawSizeY << 1));
  iVar2 = getWindowHeight(this);
  offsetY = 2.0 / (float)iVar2;
  for (local_28 = 0; local_28 < (uint)output_local; local_28 = local_28 + 1) {
    local_2c = LinesOffsetY(this,local_28,offsetY);
    pvVar1 = _i;
    tcu::Vector<float,_4>::Vector(&local_3c,-1.0,local_2c,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (pvVar1,&local_3c);
    pvVar1 = _i;
    tcu::Vector<float,_4>::Vector(&local_4c,1.0,local_2c,0.0,1.0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
              (pvVar1,&local_4c);
  }
  return;
}

Assistant:

void LinesGen(unsigned int, unsigned int drawSizeY, CColorArray& output)
	{
		output.reserve(drawSizeY * 2);
		float rasterSize = 2.0f / static_cast<float>(getWindowHeight());
		for (unsigned int i = 0; i < drawSizeY; ++i)
		{
			float offsetY = LinesOffsetY(i, rasterSize);
			output.push_back(tcu::Vec4(-1.0f, offsetY, 0.0f, 1.0f));
			output.push_back(tcu::Vec4(1.0f, offsetY, 0.0f, 1.0f));
		}
	}